

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  char *pcVar22;
  size_t sVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar40;
  undefined1 auVar39 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar41 [16];
  float fVar44;
  float fVar46;
  float fVar47;
  undefined1 auVar45 [16];
  float fVar48;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  size_t local_1b8;
  size_t local_1b0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar26._8_8_ = 0;
  auVar26._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar26._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = time_range->lower;
  auVar29._4_4_ = time_range->upper;
  auVar27 = vcmpps_avx(auVar26,auVar29,1);
  auVar8 = vinsertps_avx(auVar29,auVar26,0x50);
  auVar26 = vinsertps_avx(auVar26,auVar29,0x50);
  local_b8 = vblendvps_avx(auVar26,auVar8,auVar27);
  auVar34 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar35 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    uVar19 = r->_begin;
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1b8 = __return_storage_ptr__->end;
    if (uVar19 < r->_end) {
      auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar37 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar38 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1b0 = k;
      do {
        BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = BVar2.lower;
        auVar27._4_4_ = BVar2.upper;
        auVar27 = vmovshdup_avx(auVar27);
        fVar24 = BVar2.lower;
        fVar40 = auVar27._0_4_ - fVar24;
        uVar17 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar19);
        uVar13 = (ulong)uVar17;
        uVar14 = (ulong)(uVar17 + 1);
        pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar14 < (pBVar3->super_RawBufferView).num) {
          fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                  super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar27 = ZEXT416((uint)(fVar1 * ((auVar34._0_4_ - fVar24) / fVar40) * 1.0000002));
          auVar27 = vroundss_avx(auVar27,auVar27,9);
          auVar27 = vmaxss_avx(auVar36._0_16_,auVar27);
          uVar17 = (uint)auVar27._0_4_;
          auVar27 = ZEXT416((uint)(fVar1 * ((auVar35._0_4_ - fVar24) / fVar40) * 0.99999976));
          auVar27 = vroundss_avx(auVar27,auVar27,10);
          auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar1));
          uVar21 = (uint)auVar27._0_4_;
          bVar7 = uVar21 < uVar17;
          if (uVar17 <= uVar21) {
            uVar18 = (ulong)(int)uVar17;
            lVar20 = uVar18 * 0x38;
            pcVar22 = pBVar3[uVar18].super_RawBufferView.ptr_ofs;
            sVar23 = pBVar3[uVar18].super_RawBufferView.stride;
            auVar26 = auVar37._0_16_;
            auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar13),auVar26,2);
            auVar29 = auVar38._0_16_;
            auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar13),auVar29,5);
            auVar27 = vorps_avx(auVar27,auVar8);
            if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar27[0xf]) {
              pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.tangents.items;
              do {
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar14),auVar26,2);
                auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar14),auVar29,5);
                auVar27 = vorps_avx(auVar27,auVar8);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') break;
                lVar5 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar20);
                lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).stride + lVar20);
                auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar13);
                auVar8 = vcmpps_avx(auVar27,auVar26,2);
                auVar27 = vcmpps_avx(auVar27,auVar29,5);
                auVar27 = vorps_avx(auVar8,auVar27);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') break;
                auVar27 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
                auVar8 = vcmpps_avx(auVar27,auVar26,2);
                auVar27 = vcmpps_avx(auVar27,auVar29,5);
                auVar27 = vorps_avx(auVar8,auVar27);
                if ((((auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar27[0xf] < '\0') break;
                uVar18 = uVar18 + 1;
                bVar7 = (ulong)(long)(int)uVar21 < uVar18;
                if ((ulong)(long)(int)uVar21 < uVar18) goto LAB_012fd0d1;
                pcVar22 = *(char **)((long)&pBVar3[1].super_RawBufferView.ptr_ofs + lVar20);
                sVar23 = *(size_t *)((long)&pBVar3[1].super_RawBufferView.stride + lVar20);
                lVar20 = lVar20 + 0x38;
                auVar27 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar13),auVar26,2);
                auVar8 = vcmpps_avx(*(undefined1 (*) [16])(pcVar22 + sVar23 * uVar13),auVar29,5);
                auVar27 = vorps_avx(auVar27,auVar8);
              } while ((((auVar27 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar27 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar27 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       -1 < auVar27[0xf]);
            }
            if (!bVar7) goto LAB_012fd593;
          }
LAB_012fd0d1:
          local_118.primID = &local_120;
          fVar40 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar25 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar40;
          fVar30 = (auVar34._0_4_ - fVar40) / fVar25;
          fVar25 = (auVar35._0_4_ - fVar40) / fVar25;
          fVar40 = fVar1 * fVar30;
          fVar24 = fVar1 * fVar25;
          auVar26 = vroundss_avx(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40),9);
          auVar29 = vroundss_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),10);
          auVar27 = vmaxss_avx(auVar26,auVar36._0_16_);
          auVar8 = vminss_avx(auVar29,ZEXT416((uint)fVar1));
          iVar16 = (int)auVar27._0_4_;
          fVar31 = auVar8._0_4_;
          uVar17 = (int)auVar26._0_4_;
          if ((int)auVar26._0_4_ < 0) {
            uVar17 = 0xffffffff;
          }
          iVar15 = (int)fVar1 + 1;
          if ((int)auVar29._0_4_ < (int)fVar1 + 1) {
            iVar15 = (int)auVar29._0_4_;
          }
          local_120 = uVar19;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar16);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar31);
          fVar40 = fVar40 - auVar27._0_4_;
          if (iVar15 - uVar17 == 1) {
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar40),ZEXT816(0) << 0x40);
            auVar8 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar39._0_4_ = auVar8._0_4_ * local_108.m128[0] + auVar27._0_4_ * local_e8.m128[0];
            auVar39._4_4_ = auVar8._4_4_ * local_108.m128[1] + auVar27._4_4_ * local_e8.m128[1];
            auVar39._8_4_ = auVar8._8_4_ * local_108.m128[2] + auVar27._8_4_ * local_e8.m128[2];
            auVar39._12_4_ = auVar8._12_4_ * local_108.m128[3] + auVar27._12_4_ * local_e8.m128[3];
            auVar41._0_4_ = auVar8._0_4_ * local_f8 + auVar27._0_4_ * local_d8;
            auVar41._4_4_ = auVar8._4_4_ * fStack_f4 + auVar27._4_4_ * fStack_d4;
            auVar41._8_4_ = auVar8._8_4_ * fStack_f0 + auVar27._8_4_ * fStack_d0;
            auVar41._12_4_ = auVar8._12_4_ * fStack_ec + auVar27._12_4_ * fStack_cc;
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar24)),ZEXT816(0) << 0x40);
            auVar8 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar32._0_4_ = auVar27._0_4_ * local_108.m128[0] + auVar8._0_4_ * local_e8.m128[0];
            auVar32._4_4_ = auVar27._4_4_ * local_108.m128[1] + auVar8._4_4_ * local_e8.m128[1];
            auVar32._8_4_ = auVar27._8_4_ * local_108.m128[2] + auVar8._8_4_ * local_e8.m128[2];
            auVar32._12_4_ = auVar27._12_4_ * local_108.m128[3] + auVar8._12_4_ * local_e8.m128[3];
            auVar45._0_4_ = auVar27._0_4_ * local_f8 + auVar8._0_4_ * local_d8;
            auVar45._4_4_ = auVar27._4_4_ * fStack_f4 + auVar8._4_4_ * fStack_d4;
            auVar45._8_4_ = auVar27._8_4_ * fStack_f0 + auVar8._8_4_ * fStack_d0;
            auVar45._12_4_ = auVar27._12_4_ * fStack_ec + auVar8._12_4_ * fStack_cc;
            auVar27 = ZEXT416(0) << 0x20;
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar16 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar31 + -1));
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar40),ZEXT816(0) << 0x40);
            auVar8 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar39._0_4_ = auVar8._0_4_ * local_58.m128[0] + auVar27._0_4_ * local_e8.m128[0];
            auVar39._4_4_ = auVar8._4_4_ * local_58.m128[1] + auVar27._4_4_ * local_e8.m128[1];
            auVar39._8_4_ = auVar8._8_4_ * local_58.m128[2] + auVar27._8_4_ * local_e8.m128[2];
            auVar39._12_4_ = auVar8._12_4_ * local_58.m128[3] + auVar27._12_4_ * local_e8.m128[3];
            auVar41._0_4_ = auVar8._0_4_ * local_48 + auVar27._0_4_ * local_d8;
            auVar41._4_4_ = auVar8._4_4_ * fStack_44 + auVar27._4_4_ * fStack_d4;
            auVar41._8_4_ = auVar8._8_4_ * fStack_40 + auVar27._8_4_ * fStack_d0;
            auVar41._12_4_ = auVar8._12_4_ * fStack_3c + auVar27._12_4_ * fStack_cc;
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar31 - fVar24)),ZEXT816(0) << 0x40);
            auVar8 = vshufps_avx(auVar27,auVar27,0);
            auVar27 = ZEXT416((uint)(1.0 - auVar27._0_4_));
            auVar27 = vshufps_avx(auVar27,auVar27,0);
            auVar32._0_4_ = auVar8._0_4_ * local_78.m128[0] + auVar27._0_4_ * local_108.m128[0];
            auVar32._4_4_ = auVar8._4_4_ * local_78.m128[1] + auVar27._4_4_ * local_108.m128[1];
            auVar32._8_4_ = auVar8._8_4_ * local_78.m128[2] + auVar27._8_4_ * local_108.m128[2];
            auVar32._12_4_ = auVar8._12_4_ * local_78.m128[3] + auVar27._12_4_ * local_108.m128[3];
            auVar45._0_4_ = auVar8._0_4_ * local_68 + auVar27._0_4_ * local_f8;
            auVar45._4_4_ = auVar8._4_4_ * fStack_64 + auVar27._4_4_ * fStack_f4;
            auVar45._8_4_ = auVar8._8_4_ * fStack_60 + auVar27._8_4_ * fStack_f0;
            auVar45._12_4_ = auVar8._12_4_ * fStack_5c + auVar27._12_4_ * fStack_ec;
            if ((int)(uVar17 + 1) < iVar15) {
              sVar23 = (size_t)(uVar17 + 1);
              iVar15 = ~uVar17 + iVar15;
              do {
                auVar28._0_4_ = ((float)(int)sVar23 / fVar1 - fVar30) / (fVar25 - fVar30);
                auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar27 = vshufps_avx(auVar28,auVar28,0);
                local_1c8 = auVar32._0_4_;
                fStack_1c4 = auVar32._4_4_;
                fStack_1c0 = auVar32._8_4_;
                fStack_1bc = auVar32._12_4_;
                auVar8 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                     ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
                fVar40 = auVar39._4_4_;
                fVar24 = auVar39._8_4_;
                fVar31 = auVar39._12_4_;
                fVar46 = auVar45._4_4_;
                fVar47 = auVar45._8_4_;
                fVar48 = auVar45._12_4_;
                fVar42 = auVar41._4_4_;
                fVar43 = auVar41._8_4_;
                fVar44 = auVar41._12_4_;
                local_a8 = auVar45._0_4_ * auVar27._0_4_ + auVar41._0_4_ * auVar8._0_4_;
                fStack_a4 = fVar46 * auVar27._4_4_ + fVar42 * auVar8._4_4_;
                fStack_a0 = fVar47 * auVar27._8_4_ + fVar43 * auVar8._8_4_;
                fStack_9c = fVar48 * auVar27._12_4_ + fVar44 * auVar8._12_4_;
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar23);
                auVar11._4_4_ = auVar27._4_4_ * fStack_1c4 + fVar40 * auVar8._4_4_;
                auVar11._0_4_ = auVar27._0_4_ * local_1c8 + auVar39._0_4_ * auVar8._0_4_;
                auVar11._8_4_ = auVar27._8_4_ * fStack_1c0 + fVar24 * auVar8._8_4_;
                auVar11._12_4_ = auVar27._12_4_ * fStack_1bc + fVar31 * auVar8._12_4_;
                auVar27 = vsubps_avx((undefined1  [16])local_98,auVar11);
                auVar8._4_4_ = fStack_a4;
                auVar8._0_4_ = local_a8;
                auVar8._8_4_ = fStack_a0;
                auVar8._12_4_ = fStack_9c;
                auVar26 = vsubps_avx(local_88,auVar8);
                auVar8 = vminps_avx(auVar27,ZEXT816(0) << 0x40);
                auVar27 = vmaxps_avx(auVar26,ZEXT816(0) << 0x40);
                auVar39._0_4_ = auVar39._0_4_ + auVar8._0_4_;
                auVar39._4_4_ = fVar40 + auVar8._4_4_;
                auVar39._8_4_ = fVar24 + auVar8._8_4_;
                auVar39._12_4_ = fVar31 + auVar8._12_4_;
                auVar32._0_4_ = local_1c8 + auVar8._0_4_;
                auVar32._4_4_ = fStack_1c4 + auVar8._4_4_;
                auVar32._8_4_ = fStack_1c0 + auVar8._8_4_;
                auVar32._12_4_ = fStack_1bc + auVar8._12_4_;
                auVar41._0_4_ = auVar41._0_4_ + auVar27._0_4_;
                auVar41._4_4_ = fVar42 + auVar27._4_4_;
                auVar41._8_4_ = fVar43 + auVar27._8_4_;
                auVar41._12_4_ = fVar44 + auVar27._12_4_;
                auVar45._0_4_ = auVar45._0_4_ + auVar27._0_4_;
                auVar45._4_4_ = fVar46 + auVar27._4_4_;
                auVar45._8_4_ = fVar47 + auVar27._8_4_;
                auVar45._12_4_ = fVar48 + auVar27._12_4_;
                sVar23 = sVar23 + 1;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
            }
            auVar27 = ZEXT816(0) << 0x40;
          }
          auVar36 = ZEXT1664(auVar27);
          auVar27 = vcmpps_avx(auVar39,auVar41,2);
          uVar12 = vmovmskps_avx(auVar27);
          auVar34 = ZEXT1664(local_b8);
          auVar35 = ZEXT1664(local_c8);
          auVar37 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar38 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if ((~(byte)uVar12 & 7) == 0) {
            auVar27 = vcmpps_avx(auVar32,auVar45,2);
            uVar12 = vmovmskps_avx(auVar27);
            if ((~(byte)uVar12 & 7) == 0) {
              auVar27 = vminps_avx(auVar39,auVar32);
              aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
              auVar27 = vmaxps_avx(auVar41,auVar45);
              aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar27,ZEXT416((uint)uVar19),0x30);
              auVar33._0_4_ = aVar9.x + aVar10.x;
              auVar33._4_4_ = aVar9.y + aVar10.y;
              auVar33._8_4_ = aVar9.z + aVar10.z;
              auVar33._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
              local_168 = vminps_avx(local_168,(undefined1  [16])aVar9);
              local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar10);
              local_188 = vminps_avx(local_188,auVar33);
              local_198 = vmaxps_avx(local_198,auVar33);
              local_1b8 = local_1b8 + 1;
              prims[local_1b0].lower.field_0.field_1 = aVar9;
              prims[local_1b0].upper.field_0.field_1 = aVar10;
              local_1b0 = local_1b0 + 1;
            }
          }
        }
LAB_012fd593:
        uVar19 = uVar19 + 1;
      } while (uVar19 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1b8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }